

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O3

void __thiscall icu_63::Edits::addUnchanged(Edits *this,int32_t unchangedLength)

{
  ushort uVar1;
  uint16_t *puVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if ((unchangedLength != 0) && (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (unchangedLength < 0) {
      this->errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      lVar4 = (long)this->length;
      if (0 < lVar4) {
        puVar2 = this->array;
        uVar1 = puVar2[lVar4 + -1];
        if (uVar1 < 0xfff) {
          uVar5 = 0xfff - uVar1;
          uVar6 = unchangedLength - uVar5;
          if ((uint)unchangedLength < uVar5 || uVar6 == 0) {
            puVar2[lVar4 + -1] = uVar1 + (short)unchangedLength;
            return;
          }
          puVar2[lVar4 + -1] = 0xfff;
          unchangedLength = uVar6;
        }
      }
      uVar5 = unchangedLength;
      if (0xfff < unchangedLength) {
        do {
          append(this,0xfff);
          unchangedLength = uVar5 - 0x1000;
          bVar3 = 0x1fff < uVar5;
          uVar5 = unchangedLength;
        } while (bVar3);
      }
      if (0 < unchangedLength) {
        append(this,unchangedLength - 1);
        return;
      }
    }
  }
  return;
}

Assistant:

void Edits::addUnchanged(int32_t unchangedLength) {
    if(U_FAILURE(errorCode_) || unchangedLength == 0) { return; }
    if(unchangedLength < 0) {
        errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    // Merge into previous unchanged-text record, if any.
    int32_t last = lastUnit();
    if(last < MAX_UNCHANGED) {
        int32_t remaining = MAX_UNCHANGED - last;
        if (remaining >= unchangedLength) {
            setLastUnit(last + unchangedLength);
            return;
        }
        setLastUnit(MAX_UNCHANGED);
        unchangedLength -= remaining;
    }
    // Split large lengths into multiple units.
    while(unchangedLength >= MAX_UNCHANGED_LENGTH) {
        append(MAX_UNCHANGED);
        unchangedLength -= MAX_UNCHANGED_LENGTH;
    }
    // Write a small (remaining) length.
    if(unchangedLength > 0) {
        append(unchangedLength - 1);
    }
}